

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::UniformCase::generateBasicUniforms
          (UniformCase *this,
          vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
          *basicUniformsDst,
          vector<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
          *basicUniformReportsDst,VarType *varType,char *varName,bool isParentActive,
          int *samplerUnitCounter,Random *rnd)

{
  undefined8 *puVar1;
  undefined1 *puVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  DataType DVar4;
  StructType *pSVar5;
  VarType *varType_00;
  long *plVar6;
  undefined8 *puVar7;
  int iVar8;
  int samplerUnit;
  size_type *psVar9;
  _Bit_type *p_Var10;
  long *plVar11;
  ulong *puVar12;
  ulong uVar13;
  int elemNdx_;
  uint uVar14;
  long lVar15;
  undefined8 uVar16;
  _Alloc_hider _Var17;
  pointer pSVar18;
  long lVar19;
  bool bVar20;
  vector<bool,_std::allocator<bool>_> isElemActive;
  string arrayRootName;
  VarValue value;
  ulong *local_250;
  long local_248;
  ulong local_240;
  long lStack_238;
  int local_22c;
  ulong *local_228;
  long local_220;
  ulong local_218 [2];
  string indexedName;
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  long *local_1c8 [2];
  long local_1b8 [2];
  string memberFullName;
  _Alloc_hider local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128 [15];
  
  if (varType->m_type == TYPE_ARRAY) {
    iVar8 = (varType->m_data).array.size;
    puVar2 = (undefined1 *)((long)&value.val + 0xc);
    value._0_8_ = puVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&value,0x1b3c1e9);
    plVar6 = (long *)std::__cxx11::string::append((char *)&value);
    paVar3 = &memberFullName.field_2;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar9) {
      memberFullName.field_2._M_allocated_capacity = *psVar9;
      memberFullName.field_2._8_8_ = plVar6[3];
      memberFullName._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      memberFullName.field_2._M_allocated_capacity = *psVar9;
      memberFullName._M_dataplus._M_p = (pointer)*plVar6;
    }
    memberFullName._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&memberFullName);
    arrayRootName._M_dataplus._M_p = (pointer)&arrayRootName.field_2;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar9) {
      arrayRootName.field_2._M_allocated_capacity = *psVar9;
      arrayRootName.field_2._8_8_ = plVar6[3];
    }
    else {
      arrayRootName.field_2._M_allocated_capacity = *psVar9;
      arrayRootName._M_dataplus._M_p = (pointer)*plVar6;
    }
    arrayRootName._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)memberFullName._M_dataplus._M_p != paVar3) {
      operator_delete(memberFullName._M_dataplus._M_p,
                      memberFullName.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)value._0_8_ != puVar2) {
      operator_delete((void *)value._0_8_,value.val._12_8_ + 1);
    }
    elemNdx_ = 0;
    isElemActive.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    isElemActive.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._8_8_ =
         (ulong)(uint)isElemActive.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_ << 0x20;
    isElemActive.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    isElemActive.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._8_8_ =
         (ulong)(uint)isElemActive.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_ << 0x20;
    isElemActive.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
    uVar14 = (varType->m_data).array.size;
    if (0 < (int)uVar14) {
      local_22c = iVar8 / 2;
      do {
        local_1c8[0] = local_1b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,0x1b3c1e9);
        plVar6 = (long *)std::__cxx11::string::append((char *)local_1c8);
        local_1e8 = &local_1d8;
        plVar11 = plVar6 + 2;
        if ((long *)*plVar6 == plVar11) {
          local_1d8 = *plVar11;
          lStack_1d0 = plVar6[3];
        }
        else {
          local_1d8 = *plVar11;
          local_1e8 = (long *)*plVar6;
        }
        local_1e0 = plVar6[1];
        *plVar6 = (long)plVar11;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_1e8);
        local_250 = &local_240;
        puVar12 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar12) {
          local_240 = *puVar12;
          lStack_238 = plVar6[3];
        }
        else {
          local_240 = *puVar12;
          local_250 = (ulong *)*plVar6;
        }
        local_248 = plVar6[1];
        *plVar6 = (long)puVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&memberFullName);
        std::ostream::operator<<(&memberFullName,elemNdx_);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&memberFullName);
        std::ios_base::~ios_base((ios_base *)&local_138);
        uVar13 = 0xf;
        if (local_250 != &local_240) {
          uVar13 = local_240;
        }
        if (uVar13 < (ulong)(local_220 + local_248)) {
          uVar13 = 0xf;
          if (local_228 != local_218) {
            uVar13 = local_218[0];
          }
          if (uVar13 < (ulong)(local_220 + local_248)) goto LAB_015794b4;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,(ulong)local_250);
        }
        else {
LAB_015794b4:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_250,(ulong)local_228);
        }
        value._0_8_ = (long)&value.val + 0xc;
        puVar1 = puVar7 + 2;
        if ((undefined8 *)*puVar7 == puVar1) {
          value.val._12_8_ = *puVar1;
          value.val._20_8_ = puVar7[3];
        }
        else {
          value.val._12_8_ = *puVar1;
          value._0_8_ = (undefined8 *)*puVar7;
        }
        value.val._4_8_ = puVar7[1];
        *puVar7 = puVar1;
        puVar7[1] = 0;
        *(undefined1 *)puVar1 = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&value);
        indexedName._M_dataplus._M_p = (pointer)&indexedName.field_2;
        psVar9 = (size_type *)(plVar6 + 2);
        if ((size_type *)*plVar6 == psVar9) {
          indexedName.field_2._M_allocated_capacity = *psVar9;
          indexedName.field_2._8_8_ = plVar6[3];
        }
        else {
          indexedName.field_2._M_allocated_capacity = *psVar9;
          indexedName._M_dataplus._M_p = (pointer)*plVar6;
        }
        indexedName._M_string_length = plVar6[1];
        *plVar6 = (long)psVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((undefined1 *)value._0_8_ != (undefined1 *)((long)&value.val + 0xc)) {
          operator_delete((void *)value._0_8_,value.val._12_8_ + 1);
        }
        if (local_228 != local_218) {
          operator_delete(local_228,local_218[0] + 1);
        }
        if (local_250 != &local_240) {
          operator_delete(local_250,local_240 + 1);
        }
        if (local_1e8 != &local_1d8) {
          operator_delete(local_1e8,local_1d8 + 1);
        }
        if (local_1c8[0] != local_1b8) {
          operator_delete(local_1c8[0],local_1b8[0] + 1);
        }
        if ((isParentActive) &&
           ((uVar14 = *(uint *)&(this->super_CallLogWrapper).field_0x14, (uVar14 & 0x20) == 0 ||
            (((uint)(*(int *)&(basicUniformsDst->
                              super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                    *(int *)&(basicUniformsDst->
                             super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 3 & 1) == 0)))) {
          bVar20 = local_22c == elemNdx_ || (uVar14 & 1) == 0;
        }
        else {
          bVar20 = false;
        }
        std::vector<bool,_std::allocator<bool>_>::push_back(&isElemActive,bVar20);
        varType_00 = (varType->m_data).array.elementType;
        if (varType_00->m_type == TYPE_BASIC) {
          DVar4 = (varType_00->m_data).basic.type;
          samplerUnit = -1;
          if (DVar4 - TYPE_SAMPLER_1D < 0x1e) {
            samplerUnit = *samplerUnitCounter;
            *samplerUnitCounter = samplerUnit + 1;
          }
          generateRandomVarValue(&value,DVar4,rnd,samplerUnit);
          BasicUniform::BasicUniform
                    ((BasicUniform *)&memberFullName,indexedName._M_dataplus._M_p,DVar4,bVar20,
                     &value,arrayRootName._M_dataplus._M_p,elemNdx_,iVar8);
          std::
          vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
          ::emplace_back<deqp::gles31::Functional::UniformCase::BasicUniform>
                    (basicUniformsDst,(BasicUniform *)&memberFullName);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_p != local_128) {
            operator_delete(local_138._M_p,local_128[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)memberFullName._M_dataplus._M_p != paVar3) {
            operator_delete(memberFullName._M_dataplus._M_p,
                            memberFullName.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          generateBasicUniforms
                    (this,basicUniformsDst,basicUniformReportsDst,varType_00,
                     indexedName._M_dataplus._M_p,bVar20,samplerUnitCounter,rnd);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)indexedName._M_dataplus._M_p != &indexedName.field_2) {
          operator_delete(indexedName._M_dataplus._M_p,indexedName.field_2._M_allocated_capacity + 1
                         );
        }
        elemNdx_ = elemNdx_ + 1;
        uVar14 = (varType->m_data).array.size;
      } while (elemNdx_ < (int)uVar14);
    }
    if (((varType->m_data).array.elementType)->m_type == TYPE_BASIC) {
      uVar13 = (ulong)uVar14;
      do {
        if ((int)uVar13 < 1) break;
        uVar13 = uVar13 - 1;
      } while ((isElemActive.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar13 >> 6] >>
                (uVar13 & 0x3f) & 1) == 0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&memberFullName,arrayRootName._M_dataplus._M_p,(allocator<char> *)&value)
      ;
      std::
      vector<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
      ::emplace_back<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>
                (basicUniformReportsDst,(BasicUniformReportRef *)&memberFullName);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)memberFullName._M_dataplus._M_p != paVar3) {
        operator_delete(memberFullName._M_dataplus._M_p,
                        memberFullName.field_2._M_allocated_capacity + 1);
      }
    }
    if (isElemActive.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(isElemActive.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)isElemActive.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)isElemActive.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      isElemActive.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      isElemActive.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._8_8_ =
           isElemActive.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
      isElemActive.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      isElemActive.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._8_8_ =
           isElemActive.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
      isElemActive.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    uVar16 = arrayRootName.field_2._M_allocated_capacity;
    _Var17._M_p = arrayRootName._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)arrayRootName._M_dataplus._M_p == &arrayRootName.field_2) {
      return;
    }
  }
  else {
    if (varType->m_type != TYPE_BASIC) {
      pSVar5 = (varType->m_data).structPtr;
      pSVar18 = (pSVar5->m_members).
                super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((int)((ulong)((long)(pSVar5->m_members).
                              super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar18) >> 3) *
          -0x49249249 < 1) {
        return;
      }
      lVar19 = 0x20;
      lVar15 = 0;
      do {
        arrayRootName._M_dataplus._M_p = (pointer)&arrayRootName.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&arrayRootName,0x1b3c1e9);
        plVar6 = (long *)std::__cxx11::string::append((char *)&arrayRootName);
        isElemActive.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p =
             (_Bit_type *)
             &isElemActive.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish;
        p_Var10 = (_Bit_type *)(plVar6 + 2);
        if ((_Bit_type *)*plVar6 == p_Var10) {
          isElemActive.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*p_Var10;
          isElemActive.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._8_8_ = plVar6[3];
        }
        else {
          isElemActive.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*p_Var10;
          isElemActive.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar6;
        }
        isElemActive.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._8_8_ = plVar6[1];
        *plVar6 = (long)p_Var10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&isElemActive);
        value._0_8_ = (long)&value.val + 0xc;
        plVar11 = plVar6 + 2;
        if ((long *)*plVar6 == plVar11) {
          value.val._12_8_ = *plVar11;
          value.val._20_8_ = plVar6[3];
        }
        else {
          value.val._12_8_ = *plVar11;
          value._0_8_ = (long *)*plVar6;
        }
        value.val._4_8_ = plVar6[1];
        *plVar6 = (long)plVar11;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&value);
        memberFullName._M_dataplus._M_p = (pointer)&memberFullName.field_2;
        psVar9 = (size_type *)(plVar6 + 2);
        if ((size_type *)*plVar6 == psVar9) {
          memberFullName.field_2._M_allocated_capacity = *psVar9;
          memberFullName.field_2._8_8_ = plVar6[3];
        }
        else {
          memberFullName.field_2._M_allocated_capacity = *psVar9;
          memberFullName._M_dataplus._M_p = (pointer)*plVar6;
        }
        memberFullName._M_string_length = plVar6[1];
        *plVar6 = (long)psVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((undefined1 *)value._0_8_ != (undefined1 *)((long)&value.val + 0xc)) {
          operator_delete((void *)value._0_8_,value.val._12_8_ + 1);
        }
        if ((_Bit_iterator *)
            isElemActive.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
            ._M_start.super__Bit_iterator_base._M_p !=
            &isElemActive.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish) {
          operator_delete(isElemActive.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                          (long)isElemActive.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p + 1
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)arrayRootName._M_dataplus._M_p != &arrayRootName.field_2) {
          operator_delete(arrayRootName._M_dataplus._M_p,
                          arrayRootName.field_2._M_allocated_capacity + 1);
        }
        generateBasicUniforms
                  (this,basicUniformsDst,basicUniformReportsDst,
                   (VarType *)((long)&(pSVar18->m_name)._M_dataplus._M_p + lVar19),
                   memberFullName._M_dataplus._M_p,isParentActive,samplerUnitCounter,rnd);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)memberFullName._M_dataplus._M_p != &memberFullName.field_2) {
          operator_delete(memberFullName._M_dataplus._M_p,
                          memberFullName.field_2._M_allocated_capacity + 1);
        }
        lVar15 = lVar15 + 1;
        pSVar18 = (pSVar5->m_members).
                  super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar19 = lVar19 + 0x38;
      } while (lVar15 < (int)((ulong)((long)(pSVar5->m_members).
                                            super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pSVar18) >> 3) * -0x49249249);
      return;
    }
    if (isParentActive) {
      bVar20 = true;
      if (((this->super_CallLogWrapper).field_0x14 & 0x20) != 0) {
        bVar20 = ((uint)(*(int *)&(basicUniformsDst->
                                  super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                        *(int *)&(basicUniformsDst->
                                 super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                                 )._M_impl.super__Vector_impl_data._M_start) >> 3 & 1) == 0;
      }
    }
    else {
      bVar20 = false;
    }
    DVar4 = (varType->m_data).basic.type;
    iVar8 = -1;
    if (DVar4 - TYPE_SAMPLER_1D < 0x1e) {
      iVar8 = *samplerUnitCounter;
      *samplerUnitCounter = iVar8 + 1;
    }
    generateRandomVarValue(&value,DVar4,rnd,iVar8);
    BasicUniform::BasicUniform
              ((BasicUniform *)&memberFullName,varName,(varType->m_data).basic.type,bVar20,&value,
               (char *)0x0,-1,1);
    std::
    vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
    ::emplace_back<deqp::gles31::Functional::UniformCase::BasicUniform>
              (basicUniformsDst,(BasicUniform *)&memberFullName);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_p != local_128) {
      operator_delete(local_138._M_p,local_128[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)memberFullName._M_dataplus._M_p != &memberFullName.field_2) {
      operator_delete(memberFullName._M_dataplus._M_p,
                      memberFullName.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&memberFullName,varName,(allocator<char> *)&isElemActive);
    std::
    vector<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
    ::emplace_back<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>
              (basicUniformReportsDst,(BasicUniformReportRef *)&memberFullName);
    uVar16 = memberFullName.field_2._M_allocated_capacity;
    _Var17 = memberFullName._M_dataplus;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)memberFullName._M_dataplus._M_p == &memberFullName.field_2) {
      return;
    }
  }
  operator_delete(_Var17._M_p,uVar16 + 1);
  return;
}

Assistant:

void UniformCase::generateBasicUniforms (vector<BasicUniform>& basicUniformsDst, vector<BasicUniformReportRef>& basicUniformReportsDst, const glu::VarType& varType, const char* const varName, const bool isParentActive, int& samplerUnitCounter, Random& rnd) const
{
	if (varType.isBasicType())
	{
		const bool				isActive	= isParentActive && (m_features & FEATURE_UNIFORMUSAGE_EVERY_OTHER ? basicUniformsDst.size() % 2 == 0 : true);
		const glu::DataType		type		= varType.getBasicType();
		const VarValue			value		= glu::isDataTypeSampler(type) ? generateRandomVarValue(type, rnd, samplerUnitCounter++)
																		   : generateRandomVarValue(varType.getBasicType(), rnd);

		basicUniformsDst.push_back(BasicUniform(varName, varType.getBasicType(), isActive, value));
		basicUniformReportsDst.push_back(BasicUniformReportRef(varName, varType.getBasicType(), isActive));
	}
	else if (varType.isArrayType())
	{
		const int		size			= varType.getArraySize();
		const string	arrayRootName	= string("") + varName + "[0]";
		vector<bool>	isElemActive;

		for (int elemNdx = 0; elemNdx < varType.getArraySize(); elemNdx++)
		{
			const string	indexedName		= string("") + varName + "[" + de::toString(elemNdx) + "]";
			const bool		isCurElemActive	= isParentActive																						&&
											  (m_features & FEATURE_UNIFORMUSAGE_EVERY_OTHER			? basicUniformsDst.size() % 2 == 0	: true)	&&
											  (m_features & FEATURE_ARRAYUSAGE_ONLY_MIDDLE_INDEX		? elemNdx == size/2					: true);

			isElemActive.push_back(isCurElemActive);

			if (varType.getElementType().isBasicType())
			{
				// \note We don't want separate entries in basicUniformReportsDst for elements of basic-type arrays.
				const glu::DataType	elemBasicType	= varType.getElementType().getBasicType();
				const VarValue		value			= glu::isDataTypeSampler(elemBasicType) ? generateRandomVarValue(elemBasicType, rnd, samplerUnitCounter++)
																							: generateRandomVarValue(elemBasicType, rnd);

				basicUniformsDst.push_back(BasicUniform(indexedName.c_str(), elemBasicType, isCurElemActive, value, arrayRootName.c_str(), elemNdx, size));
			}
			else
				generateBasicUniforms(basicUniformsDst, basicUniformReportsDst, varType.getElementType(), indexedName.c_str(), isCurElemActive, samplerUnitCounter, rnd);
		}

		if (varType.getElementType().isBasicType())
		{
			int minSize;
			for (minSize = varType.getArraySize(); minSize > 0 && !isElemActive[minSize-1]; minSize--);

			basicUniformReportsDst.push_back(BasicUniformReportRef(arrayRootName.c_str(), minSize, size, varType.getElementType().getBasicType(), isParentActive && minSize > 0));
		}
	}
	else
	{
		DE_ASSERT(varType.isStructType());

		const StructType& structType = *varType.getStructPtr();

		for (int i = 0; i < structType.getNumMembers(); i++)
		{
			const glu::StructMember&	member			= structType.getMember(i);
			const string				memberFullName	= string("") + varName + "." + member.getName();

			generateBasicUniforms(basicUniformsDst, basicUniformReportsDst, member.getType(), memberFullName.c_str(), isParentActive, samplerUnitCounter, rnd);
		}
	}
}